

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

shared_ptr<aeron::Counter> __thiscall
aeron::ClientConductor::findCounter(ClientConductor *this,int64_t registrationId)

{
  anon_class_8_1_0d1909f2_for__M_pred __pred;
  bool bVar1;
  longlong lVar2;
  long __val;
  char *pcVar3;
  string *what;
  string *function;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<aeron::Counter> sVar4;
  CounterStateDefn *state;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  it;
  lock_guard<std::recursive_mutex> lock;
  shared_ptr<aeron::Counter> *counter;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  function<long_long_()> *in_stack_fffffffffffffe10;
  int line;
  string *file;
  string *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int32_t errorCode;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  in_stack_fffffffffffffe30;
  RegistrationException *this_00;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  in_stack_fffffffffffffe38;
  allocator *paVar5;
  undefined1 local_169 [40];
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_69;
  reference local_68;
  undefined4 local_5c;
  CounterStateDefn *local_58;
  undefined8 local_40;
  CounterStateDefn *local_38;
  CounterStateDefn *local_30;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  local_28 [2];
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffe10,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_30 = (CounterStateDefn *)
             std::
             vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
             ::begin((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
                      *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_38 = (CounterStateDefn *)
             std::
             vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
             ::end((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
                    *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  local_40 = local_18;
  __pred.registrationId._4_4_ = in_stack_fffffffffffffe2c;
  __pred.registrationId._0_4_ = in_stack_fffffffffffffe28;
  local_28[0] = std::
                find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::CounterStateDefn*,std::vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>>,aeron::ClientConductor::findCounter(long)::__0>
                          (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,__pred);
  local_58 = (CounterStateDefn *)
             std::
             vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
             ::end((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
                    *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                      *)in_stack_fffffffffffffe10,
                     (__normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  if (bVar1) {
    std::shared_ptr<aeron::Counter>::shared_ptr((shared_ptr<aeron::Counter> *)0x1f51b9);
  }
  else {
    local_68 = __gnu_cxx::
               __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
               ::operator*(local_28);
    local_69 = 0;
    std::weak_ptr<aeron::Counter>::lock((weak_ptr<aeron::Counter> *)in_stack_fffffffffffffe18);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_68->m_counterCache);
    if (bVar1) {
      std::__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_fffffffffffffe20);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
    if ((bVar1) || (local_68->m_status != AWAITING_MEDIA_DRIVER)) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
      if ((!bVar1) && (local_68->m_status == ERRORED_MEDIA_DRIVER)) {
        what = (string *)__cxa_allocate_exception(0x50);
        errorCode = local_68->m_errorCode;
        this_00 = (RegistrationException *)&local_68->m_errorMessage;
        paVar5 = &local_141;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_140,
                   "std::shared_ptr<Counter> aeron::ClientConductor::findCounter(std::int64_t)",
                   paVar5);
        function = (string *)util::past_prefix((char *)what,(char *)in_stack_fffffffffffffe18);
        file = (string *)local_169;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_169 + 1),(char *)function,(allocator *)file);
        util::RegistrationException::RegistrationException
                  (this_00,errorCode,what,function,file,in_stack_fffffffffffffe0c);
        __cxa_throw(what,&util::RegistrationException::typeinfo,
                    util::RegistrationException::~RegistrationException);
      }
    }
    else {
      lVar2 = std::function<long_long_()>::operator()(in_stack_fffffffffffffe10);
      line = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
      if (local_68->m_timeOfRegistration + *(long *)(in_RSI + 0x210) < lVar2) {
        local_11a = 1;
        __val = __cxa_allocate_exception(0x48);
        std::__cxx11::to_string(__val);
        std::operator+(&local_b0,"no response from driver in ",&local_d0);
        std::operator+(&local_90,&local_b0," ms");
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_f0,
                   "std::shared_ptr<Counter> aeron::ClientConductor::findCounter(std::int64_t)",
                   &local_f1);
        pcVar3 = util::past_prefix((char *)in_stack_fffffffffffffe20,
                                   (char *)in_stack_fffffffffffffe18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_118,pcVar3,&local_119);
        util::DriverTimeoutException::DriverTimeoutException
                  ((DriverTimeoutException *)in_stack_fffffffffffffe30._M_current,
                   (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,line);
        local_11a = 0;
        __cxa_throw(__val,&util::DriverTimeoutException::typeinfo,
                    util::DriverTimeoutException::~DriverTimeoutException);
      }
    }
    local_69 = 1;
  }
  local_5c = 1;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1f5706);
  sVar4.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<aeron::Counter>)
         sVar4.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Counter> ClientConductor::findCounter(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(
        m_counters.begin(),
        m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it == m_counters.end())
    {
        return std::shared_ptr<Counter>();
    }

    CounterStateDefn& state = *it;
    std::shared_ptr<Counter> counter = state.m_counter.lock();

    if (state.m_counterCache)
    {
        state.m_counterCache.reset();
    }

    if (!counter && RegistrationStatus::AWAITING_MEDIA_DRIVER == state.m_status)
    {
        if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
        {
            throw DriverTimeoutException(
                "no response from driver in " + std::to_string(m_driverTimeoutMs) + " ms", SOURCEINFO);
        }
    }
    else if (!counter && RegistrationStatus::ERRORED_MEDIA_DRIVER == state.m_status)
    {
        throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
    }

    return counter;
}